

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsyntaxhighlighter.cpp
# Opt level: O1

void __thiscall
QSyntaxHighlighter::setFormat(QSyntaxHighlighter *this,int start,int count,QTextCharFormat *format)

{
  long lVar1;
  ulong uVar2;
  pointer pQVar3;
  int iVar4;
  long lVar5;
  
  if (-1 < start) {
    lVar1 = *(long *)&this->field_0x8;
    uVar2 = *(ulong *)(lVar1 + 0x98);
    if ((uint)start < uVar2) {
      iVar4 = count + start;
      if ((long)uVar2 < (long)iVar4) {
        iVar4 = (int)uVar2;
      }
      if (start < iVar4) {
        lVar5 = (ulong)(uint)start << 4;
        do {
          pQVar3 = QList<QTextCharFormat>::data((QList<QTextCharFormat> *)(lVar1 + 0x88));
          QTextFormat::operator=
                    ((QTextFormat *)((long)&(pQVar3->super_QTextFormat).d.d.ptr + lVar5),
                     &format->super_QTextFormat);
          lVar5 = lVar5 + 0x10;
          start = start + 1;
        } while (start < iVar4);
      }
    }
  }
  return;
}

Assistant:

void QSyntaxHighlighter::setFormat(int start, int count, const QTextCharFormat &format)
{
    Q_D(QSyntaxHighlighter);
    if (start < 0 || start >= d->formatChanges.size())
        return;

    const int end = qMin(start + count, d->formatChanges.size());
    for (int i = start; i < end; ++i)
        d->formatChanges[i] = format;
}